

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signals.c
# Opt level: O2

void client_once(int operation)

{
  sigaction signal_action;
  sigaction local_a0;
  
  setup_client_signals(&local_a0);
  if (operation == 0) {
    wait_for_signal(&local_a0);
  }
  else {
    notify_server();
  }
  return;
}

Assistant:

void client_once(int operation) {
	struct sigaction signal_action;
	setup_client_signals(&signal_action);
	if (operation == WAIT) {
		wait_for_signal(&signal_action);
	} else {
		notify_server();
	}
}